

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O2

Abc_Obj_t * Abc_NtkBddMux21(Abc_Ntk_t *pNtkNew,Abc_Obj_t **pFanins)

{
  DdManager *dd;
  Abc_Obj_t *pObj;
  DdNode *pDVar1;
  DdNode *h;
  DdNode *g;
  
  dd = (DdManager *)pNtkNew->pManFunc;
  pObj = Abc_NtkCreateNode(pNtkNew);
  Abc_ObjAddFanin(pObj,*pFanins);
  Abc_ObjAddFanin(pObj,pFanins[1]);
  Abc_ObjAddFanin(pObj,pFanins[2]);
  pDVar1 = Cudd_bddIthVar(dd,0);
  h = Cudd_bddIthVar(dd,1);
  g = Cudd_bddIthVar(dd,2);
  pDVar1 = Cudd_bddIte(dd,pDVar1,g,h);
  (pObj->field_5).pData = pDVar1;
  Cudd_Ref(pDVar1);
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkBddMux21( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pFanins[] )
{
    DdManager * dd = (DdManager *)pNtkNew->pManFunc;
    Abc_Obj_t * pNode;
    DdNode * bSpin, * bCof0, * bCof1;
    pNode = Abc_NtkCreateNode( pNtkNew );
    Abc_ObjAddFanin( pNode, pFanins[0] );
    Abc_ObjAddFanin( pNode, pFanins[1] );
    Abc_ObjAddFanin( pNode, pFanins[2] );
    bSpin = Cudd_bddIthVar(dd, 0);
    bCof0 = Cudd_bddIthVar(dd, 1); 
    bCof1 = Cudd_bddIthVar(dd, 2); 
    pNode->pData = Cudd_bddIte( dd, bSpin, bCof1, bCof0 );  Cudd_Ref( (DdNode *)pNode->pData ); 
    return pNode;
}